

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

int handle_stream_frame(quicly_conn_t *conn,st_quicly_handle_payload_state_t *state)

{
  ulong uVar1;
  int iVar2;
  uint64_t stream_id;
  uint8_t *end;
  quicly_stream_frame_t frame;
  quicly_stream_t *stream;
  quicly_stream_frame_t local_60;
  quicly_stream_t *local_38;
  
  end = state->end;
  uVar1 = state->frame_type;
  stream_id = ptls_decode_quicint(&state->src,end);
  iVar2 = 0x20007;
  if (stream_id != 0xffffffffffffffff) {
    local_60.stream_id = stream_id;
    if ((uVar1 & 4) == 0) {
      local_60.offset = 0;
    }
    else {
      local_60.offset = ptls_decode_quicint(&state->src,end);
      if (local_60.offset == 0xffffffffffffffff) {
        return 0x20007;
      }
    }
    if ((uVar1 & 2) == 0) {
      local_60.data.base = state->src;
      local_60.data.len = (long)end - (long)local_60.data.base;
    }
    else {
      local_60.data.len = ptls_decode_quicint(&state->src,end);
      if (local_60.data.len == 0xffffffffffffffff) {
        return 0x20007;
      }
      local_60.data.base = state->src;
      if ((ulong)((long)end - (long)local_60.data.base) < local_60.data.len) {
        return 0x20007;
      }
      end = local_60.data.base + local_60.data.len;
    }
    state->src = end;
    local_60._8_1_ = (byte)uVar1 & 1;
    iVar2 = quicly_get_or_open_stream(conn,stream_id,&local_38);
    if (local_38 != (quicly_stream_t *)0x0 && iVar2 == 0) {
      iVar2 = apply_stream_frame(local_38,&local_60);
    }
  }
  return iVar2;
}

Assistant:

static int handle_stream_frame(quicly_conn_t *conn, struct st_quicly_handle_payload_state_t *state)
{
    quicly_stream_frame_t frame;
    quicly_stream_t *stream;
    int ret;

    if ((ret = quicly_decode_stream_frame(state->frame_type, &state->src, state->end, &frame)) != 0)
        return ret;
    QUICLY_PROBE(QUICTRACE_RECV_STREAM, conn, conn->stash.now, frame.stream_id, frame.offset, frame.data.len, (int)frame.is_fin);
    if ((ret = quicly_get_or_open_stream(conn, frame.stream_id, &stream)) != 0 || stream == NULL)
        return ret;
    return apply_stream_frame(stream, &frame);
}